

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_convert.cpp
# Opt level: O2

void __thiscall
BamTools::ConvertTool::ConvertToolPrivate::PrintSam(ConvertToolPrivate *this,BamAlignment *a)

{
  ostream *this_00;
  long lVar1;
  char cVar2;
  int iVar3;
  pointer pRVar4;
  pointer pCVar5;
  ulong uVar6;
  bool bVar7;
  ostream *poVar8;
  char *pcVar9;
  char *pcVar10;
  size_t sVar11;
  BadDataException *pBVar12;
  const_iterator cigarIter;
  pointer pCVar13;
  ulong uVar14;
  allocator local_99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  ConvertToolPrivate *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string tagName;
  
  this_00 = &this->m_out;
  poVar8 = std::operator<<(this_00,(string *)a);
  poVar8 = std::operator<<(poVar8,'\t');
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  std::operator<<(poVar8,'\t');
  iVar3 = a->RefID;
  local_78 = this;
  if (((long)iVar3 < 0) ||
     (pRVar4 = (this->m_references).
               super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>._M_impl.
               super__Vector_impl_data._M_start,
     (int)(((long)(this->m_references).
                  super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)pRVar4) / 0x28) <= iVar3)) {
    std::operator<<(this_00,"*\t");
  }
  else {
    poVar8 = std::operator<<(this_00,(string *)(pRVar4 + iVar3));
    std::operator<<(poVar8,'\t');
  }
  poVar8 = (ostream *)std::ostream::operator<<(this_00,a->Position + 1);
  poVar8 = std::operator<<(poVar8,'\t');
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,a->MapQuality);
  std::operator<<(poVar8,'\t');
  pCVar13 = (a->CigarData).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pCVar5 = (a->CigarData).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pCVar13 == pCVar5) {
    std::operator<<(this_00,"*\t");
  }
  else {
    for (; pCVar13 != pCVar5; pCVar13 = pCVar13 + 1) {
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)this_00);
      std::operator<<(poVar8,pCVar13->Type);
    }
    std::operator<<(this_00,'\t');
  }
  bVar7 = BamAlignment::IsPaired(a);
  if (bVar7) {
    iVar3 = a->MateRefID;
    if (((long)iVar3 < 0) ||
       (pRVar4 = (local_78->m_references).
                 super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>._M_impl.
                 super__Vector_impl_data._M_start,
       (int)(((long)(local_78->m_references).
                    super__Vector_base<BamTools::RefData,_std::allocator<BamTools::RefData>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)pRVar4) / 0x28) <= iVar3))
    goto LAB_0010f0f4;
    if (iVar3 == a->RefID) {
      std::operator<<(this_00,"=\t");
    }
    else {
      poVar8 = std::operator<<(this_00,(string *)(pRVar4 + iVar3));
      std::operator<<(poVar8,'\t');
    }
    poVar8 = (ostream *)std::ostream::operator<<(this_00,a->MatePosition + 1);
    poVar8 = std::operator<<(poVar8,'\t');
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,a->InsertSize);
    std::operator<<(poVar8,'\t');
  }
  else {
LAB_0010f0f4:
    std::operator<<(this_00,"*\t0\t0\t");
  }
  if ((a->QueryBases)._M_string_length == 0) {
    std::operator<<(this_00,"*\t");
  }
  else {
    poVar8 = std::operator<<(this_00,(string *)&a->QueryBases);
    std::operator<<(poVar8,'\t');
  }
  if ((a->Qualities)._M_string_length != 0) {
    pcVar9 = (char *)std::__cxx11::string::at((ulong)&a->Qualities);
    if (*pcVar9 != -1) {
      std::operator<<(this_00,(string *)&a->Qualities);
      goto LAB_0010f164;
    }
  }
  std::operator<<(this_00,'*');
LAB_0010f164:
  pcVar9 = (a->TagData)._M_dataplus._M_p;
  uVar6 = (a->TagData)._M_string_length;
  uVar14 = 0;
  do {
    if (uVar6 <= uVar14) break;
    if (uVar6 - uVar14 < 4) {
      pBVar12 = (BadDataException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string((string *)&tagName,"Incomplete tag data",(allocator *)&local_98);
      BadDataException::BadDataException(pBVar12,&tagName);
      __cxa_throw(pBVar12,&BadDataException::typeinfo,BadDataException::~BadDataException);
    }
    std::__cxx11::string::substr((ulong)&tagName,(ulong)&a->TagData);
    poVar8 = std::operator<<(this_00,'\t');
    poVar8 = std::operator<<(poVar8,(string *)&tagName);
    std::operator<<(poVar8,':');
    pcVar10 = (char *)std::__cxx11::string::at((ulong)&a->TagData);
    cVar2 = *pcVar10;
    lVar1 = uVar14 + 3;
    switch(cVar2) {
    case 'A':
      poVar8 = std::operator<<(this_00,"A:");
      std::operator<<(poVar8,pcVar9[lVar1]);
      goto LAB_0010f3b8;
    case 'B':
      std::operator<<(this_00,"B:");
      sVar11 = PrintBArrayValues(local_78,pcVar9 + lVar1,uVar6 - lVar1);
      uVar14 = sVar11 + lVar1;
      break;
    case 'C':
      poVar8 = std::operator<<(this_00,"i:");
      std::ostream::operator<<(poVar8,(uint)(byte)pcVar9[lVar1]);
LAB_0010f3b8:
      uVar14 = uVar14 + 4;
      break;
    case 'D':
    case 'E':
    case 'F':
    case 'G':
switchD_0010f25b_caseD_44:
      pBVar12 = (BadDataException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string((string *)&local_70,"Unknown tag type: ",&local_99);
      std::operator+(&local_98,&local_70,*pcVar9);
      BadDataException::BadDataException(pBVar12,&local_98);
      __cxa_throw(pBVar12,&BadDataException::typeinfo,BadDataException::~BadDataException);
    case 'H':
switchD_0010f25b_caseD_48:
      poVar8 = std::operator<<(this_00,cVar2);
      std::operator<<(poVar8,':');
      for (uVar14 = uVar14 + 4; pcVar9[uVar14 - 1] != '\0'; uVar14 = uVar14 + 1) {
        std::operator<<(this_00,pcVar9[uVar14 - 1]);
      }
      break;
    case 'I':
      if (uVar6 - lVar1 < 4) {
        pBVar12 = (BadDataException *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string
                  ((string *)&local_98,"Incomplete tag data",(allocator *)&local_70);
        BadDataException::BadDataException(pBVar12,&local_98);
        __cxa_throw(pBVar12,&BadDataException::typeinfo,BadDataException::~BadDataException);
      }
      poVar8 = std::operator<<(this_00,"i:");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
LAB_0010f3ec:
      uVar14 = uVar14 + 7;
      break;
    default:
      if (cVar2 != 'S') {
        if (cVar2 == 'Z') goto switchD_0010f25b_caseD_48;
        if (cVar2 != 'c') {
          if (cVar2 == 'f') {
            if (uVar6 - lVar1 < 4) {
              pBVar12 = (BadDataException *)__cxa_allocate_exception(0x28);
              std::__cxx11::string::string
                        ((string *)&local_98,"Incomplete tag data",(allocator *)&local_70);
              BadDataException::BadDataException(pBVar12,&local_98);
              __cxa_throw(pBVar12,&BadDataException::typeinfo,BadDataException::~BadDataException);
            }
            poVar8 = std::operator<<(this_00,"f:");
            std::ostream::operator<<(poVar8,*(float *)(pcVar9 + lVar1));
          }
          else {
            if (cVar2 != 'i') {
              if (cVar2 != 's') goto switchD_0010f25b_caseD_44;
              if (uVar6 - lVar1 < 2) {
                pBVar12 = (BadDataException *)__cxa_allocate_exception(0x28);
                std::__cxx11::string::string
                          ((string *)&local_98,"Incomplete tag data",(allocator *)&local_70);
                BadDataException::BadDataException(pBVar12,&local_98);
                __cxa_throw(pBVar12,&BadDataException::typeinfo,BadDataException::~BadDataException)
                ;
              }
              poVar8 = std::operator<<(this_00,"i:");
              std::ostream::operator<<(poVar8,*(short *)(pcVar9 + lVar1));
              goto LAB_0010f364;
            }
            if (uVar6 - lVar1 < 4) {
              pBVar12 = (BadDataException *)__cxa_allocate_exception(0x28);
              std::__cxx11::string::string
                        ((string *)&local_98,"Incomplete tag data",(allocator *)&local_70);
              BadDataException::BadDataException(pBVar12,&local_98);
              __cxa_throw(pBVar12,&BadDataException::typeinfo,BadDataException::~BadDataException);
            }
            poVar8 = std::operator<<(this_00,"i:");
            std::ostream::operator<<(poVar8,*(int *)(pcVar9 + lVar1));
          }
          goto LAB_0010f3ec;
        }
        poVar8 = std::operator<<(this_00,"i:");
        std::ostream::operator<<(poVar8,(int)pcVar9[lVar1]);
        goto LAB_0010f3b8;
      }
      if (uVar6 - lVar1 < 2) {
        pBVar12 = (BadDataException *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string
                  ((string *)&local_98,"Incomplete tag data",(allocator *)&local_70);
        BadDataException::BadDataException(pBVar12,&local_98);
        __cxa_throw(pBVar12,&BadDataException::typeinfo,BadDataException::~BadDataException);
      }
      poVar8 = std::operator<<(this_00,"i:");
      std::ostream::operator<<(poVar8,*(ushort *)(pcVar9 + lVar1));
LAB_0010f364:
      uVar14 = uVar14 + 5;
    }
    if (uVar6 <= uVar14) {
      std::__cxx11::string::~string((string *)&tagName);
      break;
    }
    cVar2 = pcVar9[uVar14];
    std::__cxx11::string::~string((string *)&tagName);
  } while (cVar2 != '\0');
  std::endl<char,std::char_traits<char>>(this_00);
  return;
}

Assistant:

void ConvertTool::ConvertToolPrivate::PrintSam(const BamAlignment& a)
{

    // tab-delimited
    // <QNAME> <FLAG> <RNAME> <POS> <MAPQ> <CIGAR> <MRNM> <MPOS> <ISIZE> <SEQ> <QUAL> [ <TAG>:<VTYPE>:<VALUE> [...] ]

    // write name & alignment flag
    m_out << a.Name << '\t' << a.AlignmentFlag << '\t';

    // write reference name
    if ((a.RefID >= 0) && (a.RefID < (int)m_references.size())) {
        m_out << m_references[a.RefID].RefName << '\t';
    } else {
        m_out << "*\t";
    }

    // write position & map quality
    m_out << a.Position + 1 << '\t' << a.MapQuality << '\t';

    // write CIGAR
    const std::vector<CigarOp>& cigarData = a.CigarData;
    if (cigarData.empty()) {
        m_out << "*\t";
    } else {
        std::vector<CigarOp>::const_iterator cigarIter = cigarData.begin();
        std::vector<CigarOp>::const_iterator cigarEnd = cigarData.end();
        for (; cigarIter != cigarEnd; ++cigarIter) {
            const CigarOp& op = (*cigarIter);
            m_out << op.Length << op.Type;
        }
        m_out << '\t';
    }

    // write mate reference name, mate position, & insert size
    if (a.IsPaired() && (a.MateRefID >= 0) && (a.MateRefID < (int)m_references.size())) {
        if (a.MateRefID == a.RefID) {
            m_out << "=\t";
        } else {
            m_out << m_references[a.MateRefID].RefName << '\t';
        }
        m_out << a.MatePosition + 1 << '\t' << a.InsertSize << '\t';
    } else {
        m_out << "*\t0\t0\t";
    }

    // write sequence
    if (a.QueryBases.empty()) {
        m_out << "*\t";
    } else {
        m_out << a.QueryBases << '\t';
    }

    // write qualities
    if (a.Qualities.empty() || (a.Qualities.at(0) == (char)0xFF)) {
        m_out << '*';
    } else {
        m_out << a.Qualities;
    }

    // write tag data
    const char* tagData = a.TagData.c_str();
    const std::size_t tagDataLength = a.TagData.length();

    std::size_t index = 0;
    while (index < tagDataLength) {

        // Need at least four bytes for a tag:
        //    two for name
        //    one for type
        //    at least one for value
        if (tagDataLength - index < 4) {
            throw BadDataException("Incomplete tag data");
        }

        // write tag name
        std::string tagName = a.TagData.substr(index, 2);
        m_out << '\t' << tagName << ':';
        index += 2;

        // get data type
        char type = a.TagData.at(index);
        ++index;
        switch (type) {
            case (Constants::BAM_TAG_TYPE_ASCII):
                m_out << "A:" << tagData[index];
                ++index;
                break;

            case (Constants::BAM_TAG_TYPE_INT8):
                // force value into integer-type (instead of char value)
                m_out << "i:" << int(static_cast<int8_t>(tagData[index]));
                ++index;
                break;

            case (Constants::BAM_TAG_TYPE_UINT8):
                // force value into integer-type (instead of char value)
                m_out << "i:" << int(static_cast<uint8_t>(tagData[index]));
                ++index;
                break;

            case (Constants::BAM_TAG_TYPE_INT16):
                if (tagDataLength - index < sizeof(int16_t)) {
                    throw BadDataException("Incomplete tag data");
                }
                m_out << "i:" << BamTools::UnpackSignedShort(&tagData[index]);
                index += sizeof(int16_t);
                break;

            case (Constants::BAM_TAG_TYPE_UINT16):
                if (tagDataLength - index < sizeof(uint16_t)) {
                    throw BadDataException("Incomplete tag data");
                }
                m_out << "i:" << BamTools::UnpackUnsignedShort(&tagData[index]);
                index += sizeof(uint16_t);
                break;

            case (Constants::BAM_TAG_TYPE_INT32):
                if (tagDataLength - index < sizeof(int32_t)) {
                    throw BadDataException("Incomplete tag data");
                }
                m_out << "i:" << BamTools::UnpackSignedInt(&tagData[index]);
                index += sizeof(int32_t);
                break;

            case (Constants::BAM_TAG_TYPE_UINT32):
                if (tagDataLength - index < sizeof(uint32_t)) {
                    throw BadDataException("Incomplete tag data");
                }
                m_out << "i:" << BamTools::UnpackUnsignedInt(&tagData[index]);
                index += sizeof(uint32_t);
                break;

            case (Constants::BAM_TAG_TYPE_FLOAT):
                if (tagDataLength - index < sizeof(float)) {
                    throw BadDataException("Incomplete tag data");
                }
                m_out << "f:" << BamTools::UnpackFloat(&tagData[index]);
                index += sizeof(float);
                break;

            case (Constants::BAM_TAG_TYPE_HEX):  // fall-through
            case (Constants::BAM_TAG_TYPE_STRING):
                m_out << type << ':';
                while (tagData[index]) {
                    m_out << tagData[index];
                    ++index;
                }
                ++index;
                break;

            case (Constants::BAM_TAG_TYPE_ARRAY):
                m_out << "B:";
                index += PrintBArrayValues(tagData + index, tagDataLength - index);
                break;

            default:
                throw BadDataException(std::string("Unknown tag type: ") + tagData[0]);
        }

        if (index >= tagDataLength || tagData[index] == '\0') {
            break;
        }
    }

    m_out << std::endl;
}